

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

int CheckNonOpaque(uint8_t *alpha,int width,int height,int x_step,int y_step)

{
  int iVar1;
  
  if (alpha != (uint8_t *)0x0) {
    WebPInitAlphaProcessing();
    if (x_step == 1) {
      for (; 0 < height; height = height + -1) {
        iVar1 = (*WebPHasAlpha8b)(alpha,width);
        if (iVar1 != 0) {
          return 1;
        }
        alpha = alpha + y_step;
      }
    }
    else {
      for (; 0 < height; height = height + -1) {
        iVar1 = (*WebPHasAlpha32b)(alpha,width);
        if (iVar1 != 0) {
          return 1;
        }
        alpha = alpha + y_step;
      }
    }
  }
  return 0;
}

Assistant:

static int CheckNonOpaque(const uint8_t* alpha, int width, int height,
                          int x_step, int y_step) {
  if (alpha == NULL) return 0;
  WebPInitAlphaProcessing();
  if (x_step == 1) {
    for (; height-- > 0; alpha += y_step) {
      if (WebPHasAlpha8b(alpha, width)) return 1;
    }
  } else {
    for (; height-- > 0; alpha += y_step) {
      if (WebPHasAlpha32b(alpha, width)) return 1;
    }
  }
  return 0;
}